

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxesTest(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  long lVar2;
  Gia_Man_t *pGVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  
  Gia_ManCleanMark01(p);
  iVar8 = p->nObjs;
  if (0 < iVar8) {
    lVar2 = 0;
    iVar4 = 0;
    uVar5 = 0;
    do {
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      uVar6 = (uint)*(ulong *)(&pGVar1->field_0x0 + lVar2);
      if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
        iVar8 = (int)((uVar5 & 0xffffffff) * 0x24924925 >> 0x20);
        uVar9 = iVar4 + ((uint)((uVar5 & 0xffffffff) * 0xcccccccd >> 0x20) & 0xfffffffc) *
                        -0x10000000 & 0x40000000;
        uVar6 = (((uint)((int)uVar5 - iVar8) >> 1) + iVar8 >> 2) + (int)uVar5 & 1;
        uVar7 = (ulong)uVar6 << 0x3e | (ulong)uVar9;
        uVar10 = 0;
        if (uVar9 == 0) {
          uVar10 = uVar7;
        }
        if (uVar6 == 0) {
          uVar10 = uVar7;
        }
        *(ulong *)(&pGVar1->field_0x0 + lVar2) =
             uVar10 | *(ulong *)(&pGVar1->field_0x0 + lVar2) & 0xbfffffff3fffffff;
        iVar8 = p->nObjs;
      }
      uVar5 = uVar5 + 1;
      iVar4 = iVar4 + 0x40000000;
      lVar2 = lVar2 + 0xc;
    } while ((long)uVar5 < (long)iVar8);
  }
  pGVar3 = Gia_ManDupWithArtificalFaddBoxes(p,0,0);
  Gia_ManCleanMark01(p);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxesTest( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // label some and-gates
    Gia_ManCleanMark01( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->fMark0 = i % 5;
        pObj->fMark1 = i % 7;
        if ( pObj->fMark0 && pObj->fMark1 )
            pObj->fMark0 = pObj->fMark1 = 0;
    }

    // output new AIG
    pNew = Gia_ManDupWithArtificalFaddBoxes( p, 0, 0 );
    Gia_ManCleanMark01( p );
    return pNew;
}